

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCStream(ZSTD_CStream *zcs,unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  size_t sVar1;
  undefined8 uStack_98;
  ZSTD_CCtx_params params;
  unsigned_long_long pledgedSrcSize_local;
  ZSTD_CStream *zcs_local;
  
  params.customMem.opaque = (void *)pledgedSrcSize;
  memcpy(&uStack_98,&zcs->requestedParams,0x80);
  if (params.customMem.opaque == (void *)0x0) {
    params.customMem.opaque = (void *)0xffffffffffffffff;
  }
  params.cParams.targetLength = 1;
  params_00.fParams.checksumFlag = params.cParams.strategy;
  params_00.fParams.contentSizeFlag = 1;
  params_00.cParams.chainLog = params.format;
  params_00.cParams.hashLog = params.cParams.windowLog;
  params_00.format = (undefined4)uStack_98;
  params_00.cParams.windowLog = uStack_98._4_4_;
  params_00.cParams.searchLog = params.cParams.chainLog;
  params_00.cParams.minMatch = params.cParams.hashLog;
  params_00.cParams.targetLength = params.cParams.searchLog;
  params_00.cParams.strategy = params.cParams.minMatch;
  params_00.fParams.noDictIDFlag = params.fParams.contentSizeFlag;
  params_00.compressionLevel = params.fParams.checksumFlag;
  params_00.forceWindow = params.fParams.noDictIDFlag;
  params_00.attachDictPref = params.compressionLevel;
  params_00.nbWorkers = params.forceWindow;
  params_00._60_4_ = params.attachDictPref;
  params_00.jobSize = params._56_8_;
  params_00.overlapLog = (undefined4)params.jobSize;
  params_00.rsyncable = params.jobSize._4_4_;
  params_00.ldmParams.enableLdm = params.overlapLog;
  params_00.ldmParams.hashLog = params.rsyncable;
  params_00.ldmParams.bucketSizeLog = params.ldmParams.enableLdm;
  params_00.ldmParams.minMatchLength = params.ldmParams.hashLog;
  params_00.ldmParams.hashRateLog = params.ldmParams.bucketSizeLog;
  params_00.ldmParams.windowLog = params.ldmParams.minMatchLength;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)params.ldmParams._16_8_;
  params_00.customMem.customFree = (ZSTD_freeFunction)params.customMem.customAlloc;
  params_00.customMem.opaque = params.customMem.customFree;
  sVar1 = ZSTD_resetCStream_internal
                    (zcs,(void *)0x0,0,ZSTD_dct_auto,zcs->cdict,params_00,
                     (unsigned_long_long)params.customMem.opaque);
  return sVar1;
}

Assistant:

size_t ZSTD_resetCStream(ZSTD_CStream* zcs, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params params = zcs->requestedParams;
    DEBUGLOG(4, "ZSTD_resetCStream: pledgedSrcSize = %u", (unsigned)pledgedSrcSize);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    params.fParams.contentSizeFlag = 1;
    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}